

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NodeAddClauses(sat_solver *pSat,char *pSop0,char *pSop1,Abc_Obj_t *pNode,Vec_Int_t *vVars)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  DdNode *pDVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  char *pCube;
  int RetValue;
  int nFanins;
  int c;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vVars_local;
  Abc_Obj_t *pNode_local;
  char *pSop1_local;
  char *pSop0_local;
  sat_solver *pSat_local;
  
  iVar2 = Abc_ObjFaninNum(pNode);
  iVar3 = Abc_SopGetVarNum(pSop0);
  if (iVar2 != iVar3) {
    __assert_fail("nFanins == Abc_SopGetVarNum( pSop0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x2ac,
                  "int Abc_NodeAddClauses(sat_solver *, char *, char *, Abc_Obj_t *, Vec_Int_t *)");
  }
  pvVar1 = (pNode->field_5).pData;
  pDVar5 = Cudd_ReadOne((DdManager *)pNode->pNtk->pManFunc);
  if ((DdNode *)((ulong)pvVar1 & 0xfffffffffffffffe) == pDVar5) {
    vVars->nSize = 0;
    if (((ulong)(pNode->field_5).pData & 1) == 0) {
      lVar4 = toLit(pNode->Id);
      Vec_IntPush(vVars,lVar4);
    }
    else {
      lVar4 = toLit(pNode->Id);
      lVar4 = lit_neg(lVar4);
      Vec_IntPush(vVars,lVar4);
    }
    iVar2 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar2 == 0) {
      printf("The CNF is trivially UNSAT.\n");
      pSat_local._4_4_ = 0;
    }
    else {
      pSat_local._4_4_ = 1;
    }
  }
  else {
    RetValue = 0;
    while (pcVar6 = pSop0 + RetValue * (iVar2 + 3), *pcVar6 != '\0') {
      vVars->nSize = 0;
      for (nFanins = 0; iVar3 = Abc_ObjFaninNum(pNode), nFanins < iVar3; nFanins = nFanins + 1) {
        pAVar7 = Abc_ObjFanin(pNode,nFanins);
        if (pcVar6[nFanins] == '0') {
          lVar4 = toLit(pAVar7->Id);
          Vec_IntPush(vVars,lVar4);
        }
        else if (pcVar6[nFanins] == '1') {
          lVar4 = toLit(pAVar7->Id);
          lVar4 = lit_neg(lVar4);
          Vec_IntPush(vVars,lVar4);
        }
      }
      lVar4 = toLit(pNode->Id);
      lVar4 = lit_neg(lVar4);
      Vec_IntPush(vVars,lVar4);
      iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar3 == 0) {
        printf("The CNF is trivially UNSAT.\n");
        return 0;
      }
      RetValue = RetValue + 1;
    }
    RetValue = 0;
    while (pcVar6 = pSop1 + RetValue * (iVar2 + 3), *pcVar6 != '\0') {
      vVars->nSize = 0;
      for (nFanins = 0; iVar3 = Abc_ObjFaninNum(pNode), nFanins < iVar3; nFanins = nFanins + 1) {
        pAVar7 = Abc_ObjFanin(pNode,nFanins);
        if (pcVar6[nFanins] == '0') {
          lVar4 = toLit(pAVar7->Id);
          Vec_IntPush(vVars,lVar4);
        }
        else if (pcVar6[nFanins] == '1') {
          lVar4 = toLit(pAVar7->Id);
          lVar4 = lit_neg(lVar4);
          Vec_IntPush(vVars,lVar4);
        }
      }
      lVar4 = toLit(pNode->Id);
      Vec_IntPush(vVars,lVar4);
      iVar3 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
      if (iVar3 == 0) {
        printf("The CNF is trivially UNSAT.\n");
        return 0;
      }
      RetValue = RetValue + 1;
    }
    pSat_local._4_4_ = 1;
  }
  return pSat_local._4_4_;
}

Assistant:

int Abc_NodeAddClauses( sat_solver * pSat, char * pSop0, char * pSop1, Abc_Obj_t * pNode, Vec_Int_t * vVars )
{
    Abc_Obj_t * pFanin;
    int i, c, nFanins;
    int RetValue = 0;
    char * pCube;

    nFanins = Abc_ObjFaninNum( pNode );
    assert( nFanins == Abc_SopGetVarNum( pSop0 ) );

//    if ( nFanins == 0 )
    if ( Cudd_Regular((Abc_Obj_t *)pNode->pData) == Cudd_ReadOne((DdManager *)pNode->pNtk->pManFunc) )
    {
        vVars->nSize = 0;
//        if ( Abc_SopIsConst1(pSop1) )
        if ( !Cudd_IsComplement(pNode->pData) )
            Vec_IntPush( vVars, toLit(pNode->Id) );
        else
            Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
        return 1;
    }
 
    // add clauses for the negative phase
    for ( c = 0; ; c++ )
    {
        // get the cube
        pCube = pSop0 + c * (nFanins + 3);
        if ( *pCube == 0 )
            break;
        // add the clause
        vVars->nSize = 0;
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            if ( pCube[i] == '0' )
                Vec_IntPush( vVars, toLit(pFanin->Id) );
            else if ( pCube[i] == '1' )
                Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        }
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }

    // add clauses for the positive phase
    for ( c = 0; ; c++ )
    {
        // get the cube
        pCube = pSop1 + c * (nFanins + 3);
        if ( *pCube == 0 )
            break;
        // add the clause
        vVars->nSize = 0;
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            if ( pCube[i] == '0' )
                Vec_IntPush( vVars, toLit(pFanin->Id) );
            else if ( pCube[i] == '1' )
                Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        }
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }
    return 1;
}